

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

int mod2sparse_count_col(mod2sparse *m,int col)

{
  int iVar1;
  mod2entry *pmVar2;
  
  if ((-1 < col) && (col < m->n_cols)) {
    pmVar2 = m->cols + (uint)col;
    iVar1 = 0;
    while( true ) {
      pmVar2 = pmVar2->down;
      if (pmVar2->row < 0) break;
      iVar1 = iVar1 + 1;
    }
    return iVar1;
  }
  fwrite("mod2sparse_count_col: column index out of bounds\n",0x31,1,_stderr);
  exit(1);
}

Assistant:

int mod2sparse_count_col
( mod2sparse *m,
  int col
)
{
  mod2entry *e;
  int count;

  if (col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_count_col: column index out of bounds\n");
    exit(1);
  }

  count = 0;

  for (e = mod2sparse_first_in_col(m,col);
       !mod2sparse_at_end(e);
       e = mod2sparse_next_in_col(e))
  { count += 1;
  }

  return count;
}